

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BringWindowToDisplayFront(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindow **__src;
  int local_24;
  int i;
  ImGuiWindow *current_front_window;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  ppIVar2 = ImVector<ImGuiWindow_*>::back(&GImGui->Windows);
  if ((*ppIVar2 != window) && ((*ppIVar2)->RootWindow != window)) {
    for (local_24 = (pIVar1->Windows).Size + -2; -1 < local_24; local_24 = local_24 + -1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,local_24);
      if (*ppIVar2 == window) {
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,local_24);
        __src = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,local_24 + 1);
        memmove(ppIVar2,__src,(long)(((pIVar1->Windows).Size - local_24) + -1) << 3);
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,(pIVar1->Windows).Size + -1);
        *ppIVar2 = window;
        return;
      }
    }
  }
  return;
}

Assistant:

void ImGui::BringWindowToDisplayFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* current_front_window = g.Windows.back();
    if (current_front_window == window || current_front_window->RootWindow == window)
        return;
    for (int i = g.Windows.Size - 2; i >= 0; i--) // We can ignore the top-most window
        if (g.Windows[i] == window)
        {
            memmove(&g.Windows[i], &g.Windows[i + 1], (size_t)(g.Windows.Size - i - 1) * sizeof(ImGuiWindow*));
            g.Windows[g.Windows.Size - 1] = window;
            break;
        }
}